

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O2

void do_questtxt(char *infile,char *outfile)

{
  int *piVar1;
  undefined8 *puVar2;
  boolean bVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  msghdr *__ptr;
  long lVar9;
  long *plVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  int local_13c;
  char code [256];
  
  ifp = (FILE *)fopen(infile,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
    perror(infile);
  }
  else {
    ofp = (FILE *)fopen(outfile,"w+");
    if ((FILE *)ofp == (FILE *)0x0) {
      perror(outfile);
      fclose((FILE *)ifp);
    }
    else {
      qt_hdr.n_hdr = 0;
      qt_line = 0;
      in_msg = '\0';
LAB_0010a4a7:
      pcVar11 = in_line;
      pcVar5 = fgets(in_line,0x50,(FILE *)ifp);
      if (pcVar5 != (char *)0x0) {
        uVar15 = qt_line + 1;
        qt_line = uVar15;
        bVar3 = qt_control(pcVar11);
        if (bVar3 == '\0') {
          bVar3 = qt_comment(pcVar11);
          if (bVar3 == '\0') {
            if (in_msg == '\0') {
              fprintf(_stderr,"Text encountered outside message - line %d\n",(ulong)uVar15);
            }
            sVar8 = strlen(in_line);
            curr_msg->size = curr_msg->size + sVar8;
          }
        }
        else {
          local_13c = 0;
          if (in_line[1] == 'E') {
            if (in_msg == '\0') {
              pcVar5 = "End record encountered before message - line %d\n";
              goto LAB_0010a6b2;
            }
            in_msg = '\0';
          }
          else {
            if (in_line[1] == 'C') {
              if (in_msg != '\0') {
                pcVar5 = "Control record encountered during message - line %d\n";
                goto LAB_0010a6b2;
              }
              in_msg = '\x01';
              iVar4 = __isoc99_sscanf(in_line + 4,"%s %5d",code,&local_13c);
              if (iVar4 == 2) {
                iVar4 = get_hdr(code);
                if (iVar4 == 0) {
                  if (0xf < (long)qt_hdr.n_hdr) {
                    uVar12 = (ulong)(uint)qt_line;
                    pcVar5 = 
                    "Too many message types (line %d)\nAdjust N_HDR in qtext.h and recompile.\n";
                    goto LAB_0010a720;
                  }
                  strncpy(qt_hdr.id[qt_hdr.n_hdr],code,3);
                  lVar6 = (long)qt_hdr.n_hdr;
                  msg_hdr[lVar6].n_msg = 0;
                  qt_hdr.n_hdr = qt_hdr.n_hdr + 1;
                  qt_hdr.offset[lVar6] = 0;
                }
                iVar4 = get_hdr(code);
                lVar6 = (long)(iVar4 + -1);
                lVar9 = lVar6 * 0x2ee8;
                lVar7 = lVar9 + 0x1203f8;
                uVar15 = msg_hdr[lVar6].n_msg;
                uVar12 = 0;
                if (0 < (int)uVar15) {
                  uVar12 = (ulong)uVar15;
                }
                lVar14 = 0;
                do {
                  if (uVar12 * 0x18 + 0x18 == lVar14 + 0x18) {
                    if (499 < (int)uVar15) {
                      uVar12 = (ulong)(uint)qt_line;
                      pcVar5 = 
                      "Too many messages in class (line %d)\nAdjust N_MSG in qtext.h and recompile.\n"
                      ;
                      goto LAB_0010a720;
                    }
                    msg_hdr[lVar6].n_msg = uVar15 + 1;
                    lVar6 = (long)(int)uVar15 * 0x18;
                    curr_msg = (qtmsg *)(lVar7 + lVar6);
                    *(int *)(lVar7 + lVar6) = local_13c;
                    *(char *)(lVar9 + 0x1203fc + lVar6) = in_line[2];
                    puVar2 = (undefined8 *)(lVar9 + 0x120400 + lVar6);
                    *puVar2 = 0;
                    puVar2[1] = 0;
                    goto LAB_0010a4a7;
                  }
                  piVar1 = (int *)(lVar7 + lVar14);
                  lVar14 = lVar14 + 0x18;
                } while (*piVar1 != local_13c);
                uVar12 = (ulong)(uint)qt_line;
                pcVar5 = "Duplicate message number at line %d\n";
              }
              else {
                uVar12 = (ulong)(uint)qt_line;
                pcVar5 = "Unrecognized Control record at line %d\n";
              }
            }
            else {
              pcVar5 = "Unrecognized Control record at line %d\n";
LAB_0010a6b2:
              uVar12 = (ulong)uVar15;
            }
LAB_0010a720:
            fprintf(_stderr,pcVar5,uVar12);
          }
        }
        goto LAB_0010a4a7;
      }
      lVar7 = 0;
      fseek((FILE *)ifp,0,0);
      in_msg = '\0';
      lVar6 = (long)qt_hdr.n_hdr * 0xb;
      uVar12 = 0;
      if (0 < qt_hdr.n_hdr) {
        uVar12 = (ulong)(uint)qt_hdr.n_hdr;
      }
      plVar10 = qt_hdr.offset;
      for (; lVar6 = lVar6 + 4, uVar12 * 0x2ee8 - lVar7 != 0; lVar7 = lVar7 + 0x2ee8) {
        *plVar10 = lVar6;
        lVar6 = lVar6 + (long)*(int *)((long)msg_hdr[0].qt_msg + lVar7 + -8) * 0x18;
        plVar10 = plVar10 + 1;
      }
      lVar7 = 0x120408;
      lVar9 = 0;
      for (uVar13 = 0; uVar13 != uVar12; uVar13 = uVar13 + 1) {
        uVar15 = msg_hdr[uVar13].n_msg;
        if (msg_hdr[uVar13].n_msg < 1) {
          uVar15 = 0;
        }
        for (lVar14 = 0; (ulong)uVar15 * 0x18 - lVar14 != 0; lVar14 = lVar14 + 0x18) {
          *(long *)(lVar7 + -8 + lVar14) = lVar9 + lVar6;
          lVar9 = lVar9 + *(long *)(lVar7 + lVar14);
        }
        lVar7 = lVar7 + 0x2ee8;
      }
      sVar8 = fwrite(&qt_hdr,4,1,(FILE *)ofp);
      if ((int)sVar8 == 1) {
        sVar8 = fwrite(qt_hdr.id,3,(long)qt_hdr.n_hdr,(FILE *)ofp);
        if ((qt_hdr.n_hdr == (int)sVar8) &&
           (sVar8 = fwrite(qt_hdr.offset,8,(long)(int)sVar8,(FILE *)ofp), qt_hdr.n_hdr == (int)sVar8
           )) {
          lVar6 = -1;
          __ptr = msg_hdr;
          do {
            lVar6 = lVar6 + 1;
            if (qt_hdr.n_hdr <= lVar6) {
              while( true ) {
                pcVar11 = in_line;
                pcVar5 = fgets(in_line,0x50,(FILE *)ifp);
                if (pcVar5 == (char *)0x0) break;
                bVar3 = qt_control(pcVar11);
                if (bVar3 == '\0') {
                  bVar3 = qt_comment(pcVar11);
                  if (bVar3 == '\0') {
                    xcrypt(in_line);
                    fputs(xcrypt::buf,(FILE *)ofp);
                  }
                }
                else {
                  in_msg = in_line[1] == 'C';
                }
              }
              fclose((FILE *)ifp);
              fclose((FILE *)ofp);
              return;
            }
            sVar8 = fwrite(__ptr,4,1,(FILE *)ofp);
            if ((int)sVar8 != 1) break;
            sVar8 = fwrite(__ptr->qt_msg,0x18,(long)__ptr->n_msg,(FILE *)ofp);
            piVar1 = &__ptr->n_msg;
            __ptr = __ptr + 1;
          } while (*piVar1 == (int)sVar8);
        }
      }
      fwrite("Error writing record\n",0x15,1,_stderr);
    }
  }
  exit(1);
}

Assistant:

void do_questtxt(const char *infile, const char *outfile)
{
	if (!(ifp = fopen(infile, RDTMODE))) {
		perror(infile);
		exit(EXIT_FAILURE);
	}

	if (!(ofp = fopen(outfile, WRBMODE))) {
		perror(outfile);
		fclose(ifp);
		exit(EXIT_FAILURE);
	}

	qt_hdr.n_hdr = 0;
	qt_line = 0;
	in_msg = FALSE;

	while (fgets(in_line, 80, ifp) != 0) {
	    qt_line++;
	    if (qt_control(in_line)) do_qt_control(in_line);
	    else if (qt_comment(in_line)) continue;
	    else		    do_qt_text(in_line);
	}

	rewind(ifp);
	in_msg = FALSE;
	adjust_qt_hdrs();
	put_qt_hdrs();
	while (fgets(in_line, 80, ifp) != 0) {

		if (qt_control(in_line)) {
		    in_msg = (in_line[1] == 'C');
		    continue;
		} else if (qt_comment(in_line)) continue;
#ifdef DEBUG
		fprintf(stderr, "%ld: %s", ftell(stdout), in_line);
#endif
		fputs(xcrypt(in_line), ofp);
	}
	fclose(ifp);
	fclose(ofp);
	return;
}